

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.hpp
# Opt level: O2

GLenum Diligent::TypeToGLType(VALUE_TYPE Value)

{
  char (*in_RCX) [34];
  string msg;
  
  if (VT_FLOAT64 < Value) {
    FormatString<char[26],char[34]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Value < _countof(TypeToGLTypeMap)",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"TypeToGLType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x66);
    std::__cxx11::string::~string((string *)&msg);
  }
  return TypeToGLType::TypeToGLTypeMap[Value];
}

Assistant:

inline GLenum TypeToGLType(VALUE_TYPE Value)
{
    static_assert(VT_NUM_TYPES == 10, "Did you add a new VALUE_TYPE enum value? You may need to handle it here.");

#define CHECK_VALUE_TYPE_ENUM_VALUE(EnumElement, ExpectedValue) static_assert(EnumElement == ExpectedValue, "TypeToGLType function assumes that " #EnumElement " equals " #ExpectedValue ": fix TypeToGLTypeMap array and update this assertion.")
    // clang-format off
    CHECK_VALUE_TYPE_ENUM_VALUE(VT_UNDEFINED, 0);
    CHECK_VALUE_TYPE_ENUM_VALUE(VT_INT8,      1);
    CHECK_VALUE_TYPE_ENUM_VALUE(VT_INT16,     2);
    CHECK_VALUE_TYPE_ENUM_VALUE(VT_INT32,     3);
    CHECK_VALUE_TYPE_ENUM_VALUE(VT_UINT8,     4);
    CHECK_VALUE_TYPE_ENUM_VALUE(VT_UINT16,    5);
    CHECK_VALUE_TYPE_ENUM_VALUE(VT_UINT32,    6);
    CHECK_VALUE_TYPE_ENUM_VALUE(VT_FLOAT16,   7);
    CHECK_VALUE_TYPE_ENUM_VALUE(VT_FLOAT32,   8);
    CHECK_VALUE_TYPE_ENUM_VALUE(VT_FLOAT64,   9);
    // clang-format on
#undef CHECK_VALUE_TYPE_ENUM_VALUE

    // clang-format off
    static constexpr GLenum TypeToGLTypeMap[] =
    {
        0,                  // VT_UNDEFINED = 0
        GL_BYTE,            // VT_INT8
        GL_SHORT,           // VT_INT16
        GL_INT,             // VT_INT32
        GL_UNSIGNED_BYTE,   // VT_UINT8
        GL_UNSIGNED_SHORT,  // VT_UINT16
        GL_UNSIGNED_INT,    // VT_UINT32
        GL_HALF_FLOAT,      // VT_FLOAT16
        GL_FLOAT,           // VT_FLOAT32
        GL_DOUBLE,          // VT_FLOAT64
    };
    // clang-format on

    VERIFY_EXPR(Value < _countof(TypeToGLTypeMap));
    return TypeToGLTypeMap[Value];
}